

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

void __thiscall QMessageLogger::warning(QMessageLogger *this,QLoggingCategory *cat,char *msg,...)

{
  long lVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_238 [24];
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined4 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  __va_list_tag local_188;
  QInternalMessageLogContext ctxt;
  
  if (in_AL != '\0') {
    local_208 = in_XMM0_Da;
    local_1f8 = in_XMM1_Qa;
    local_1e8 = in_XMM2_Qa;
    local_1d8 = in_XMM3_Qa;
    local_1c8 = in_XMM4_Qa;
    local_1b8 = in_XMM5_Qa;
    local_1a8 = in_XMM6_Qa;
    local_198 = in_XMM7_Qa;
  }
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_220 = in_RCX;
  local_218 = in_R8;
  local_210 = in_R9;
  if (((cat->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
    memset(&ctxt,0xaa,0x140);
    QInternalMessageLogContext::QInternalMessageLogContext(&ctxt,&this->context,cat);
    local_188.gp_offset = 0x18;
    local_188.fp_offset = 0x30;
    local_188.overflow_arg_area = &stack0x00000008;
    local_188.reg_save_area = auStack_238;
    qt_message(QtWarningMsg,&ctxt.super_QMessageLogContext,msg,&local_188);
    if (ctxt.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
        super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
        super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged == true) {
      ctxt.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload.
      super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
      super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged = false;
      if (ctxt.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
          _M_payload.super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
          super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload._M_value.
          super_QVLABase<void_*>.super_QVLABaseBase.ptr !=
          (void *)((long)&ctxt.backtrace.
                          super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>
                          .super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload +
                  0x18U)) {
        QtPrivate::sizedFree
                  (ctxt.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                   super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload._M_value.
                   super_QVLABase<void_*>.super_QVLABaseBase.ptr,
                   ctxt.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
                   super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_payload._M_value.
                   super_QVLABase<void_*>.super_QVLABaseBase.a << 3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageLogger::warning(const QLoggingCategory &cat, const char *msg, ...) const
{
    if (!cat.isWarningEnabled())
        return;

    QInternalMessageLogContext ctxt(context, cat());

    va_list ap;
    va_start(ap, msg); // use variable arg list
    qt_message(QtWarningMsg, ctxt, msg, ap);
    va_end(ap);
}